

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

xmlSchematronPtr xmlSchematronParse(xmlSchematronParserCtxtPtr ctxt)

{
  long lVar1;
  xmlElementType xVar2;
  xmlDictPtr dict;
  xmlSchematronPtr pxVar3;
  xmlSchematronRulePtr_conflict pxVar4;
  bool bVar5;
  xmlSchematronPatternPtr_conflict pxVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  xmlDocPtr doc;
  xmlNodePtr node;
  xmlSchematronPtr schema;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  xmlChar **ppxVar12;
  xmlChar *pxVar13;
  xmlSchematronPatternPtr pxVar14;
  xmlPatternPtr pxVar15;
  xmlSchematronRulePtr_conflict rule;
  xmlSchematronRulePtr_conflict *ppxVar16;
  xmlSchematronTestPtr_conflict pxVar17;
  xmlSchematronRulePtr_conflict pxVar18;
  char *pcVar19;
  xmlSchematronPatternPtr_conflict pxVar20;
  _xmlNode *node_00;
  xmlSchematronTestType type;
  xmlChar *in_R9;
  _xmlNode *cur;
  xmlSchematronRulePtr_conflict prev;
  xmlNode *local_60;
  xmlChar *local_58;
  int local_38;
  
  if (ctxt == (xmlSchematronParserCtxtPtr)0x0) {
    return (xmlSchematronPtr)0x0;
  }
  ctxt->nberrors = 0;
  if (ctxt->URL == (xmlChar *)0x0) {
    if (ctxt->buffer != (char *)0x0) {
      doc = xmlReadMemory(ctxt->buffer,ctxt->size,(char *)0x0,(char *)0x0,2);
      if (doc == (xmlDocPtr)0x0) {
        iVar7 = 0x6e6;
LAB_00183282:
        pcVar19 = "xmlSchematronParse: could not parse.\n";
        pxVar10 = (xmlChar *)0x0;
LAB_00183285:
        xmlSchematronPErr(ctxt,(xmlNodePtr)0x0,iVar7,pcVar19,pxVar10,in_R9);
        return (xmlSchematronPtr)0x0;
      }
      pxVar10 = xmlStrdup((xmlChar *)"in_memory_buffer");
      doc->URL = pxVar10;
      pxVar10 = xmlDictLookup(ctxt->dict,(xmlChar *)"in_memory_buffer",-1);
      ctxt->URL = pxVar10;
      goto LAB_0018305a;
    }
    doc = ctxt->doc;
    if (doc == (xmlDocPtr)0x0) {
      iVar7 = 0x6de;
      goto LAB_00183282;
    }
    iVar7 = 1;
    bVar5 = false;
  }
  else {
    doc = xmlReadFile((char *)ctxt->URL,(char *)0x0,2);
    if (doc == (xmlDocPtr)0x0) {
      pxVar10 = ctxt->URL;
      pcVar19 = "xmlSchematronParse: could not load \'%s\'.\n";
      iVar7 = 0x6dd;
      goto LAB_00183285;
    }
LAB_0018305a:
    iVar7 = 0;
    bVar5 = true;
  }
  ctxt->preserve = iVar7;
  node = xmlDocGetRootElement(doc);
  if (node == (xmlNodePtr)0x0) {
    xmlSchematronPErr(ctxt,(xmlNodePtr)doc,0x6df,"The schema has no document element.\n",
                      (xmlChar *)0x0,in_R9);
    if (bVar5) {
      xmlFreeDoc(doc);
      return (xmlSchematronPtr)0x0;
    }
    return (xmlSchematronPtr)0x0;
  }
  if ((((node->type == XML_ELEMENT_NODE) && (node->ns != (xmlNs *)0x0)) &&
      (iVar7 = xmlStrEqual(node->name,"schema"), iVar7 != 0)) &&
     ((iVar7 = xmlStrEqual(node->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
      iVar7 != 0 ||
      (iVar7 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
      iVar7 != 0)))) {
    schema = (xmlSchematronPtr)(*xmlMalloc)(0x60);
    if (schema == (xmlSchematronPtr)0x0) {
      ctxt->nberrors = ctxt->nberrors + 1;
      schema = (xmlSchematronPtr)0x0;
      __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating schema");
    }
    else {
      schema->nbNamespaces = 0;
      schema->maxNamespaces = 0;
      schema->namespaces = (xmlChar **)0x0;
      schema->patterns = (xmlSchematronPatternPtr_conflict)0x0;
      schema->rules = (xmlSchematronRulePtr_conflict)0x0;
      schema->title = (xmlChar *)0x0;
      schema->nbNs = 0;
      schema->nbPattern = 0;
      schema->_private = (void *)0x0;
      schema->dict = (xmlDictPtr)0x0;
      schema->doc = (xmlDocPtr)0x0;
      *(undefined8 *)&schema->flags = 0;
      schema->name = (xmlChar *)0x0;
      *(undefined8 *)&schema->preserve = 0;
      dict = ctxt->dict;
      schema->dict = dict;
      xmlDictReference(dict);
      ctxt->schema = schema;
      for (cur = node->children; cur != (xmlNode *)0x0; cur = cur->next) {
        if (((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
           ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
            iVar7 != 0 ||
            (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
            iVar7 != 0)))) {
          if ((((cur->type != XML_ELEMENT_NODE) || (cur->ns == (xmlNs *)0x0)) ||
              (iVar7 = xmlStrEqual(cur->name,(xmlChar *)"title"), iVar7 == 0)) ||
             ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
              iVar7 == 0 &&
              (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
              iVar7 == 0)))) goto LAB_001833d2;
          pxVar10 = xmlNodeGetContent(cur);
          if (pxVar10 != (xmlChar *)0x0) {
            pxVar11 = xmlDictLookup(schema->dict,pxVar10,-1);
            schema->title = pxVar11;
            (*xmlFree)(pxVar10);
          }
          cur = cur->next;
          goto joined_r0x0018337f;
        }
      }
LAB_0018317d:
      if (schema->nbPattern != 0) {
        schema->doc = doc;
        if (!bVar5) {
          schema->preserve = 1;
        }
        goto LAB_001831cd;
      }
      xmlSchematronPErr(ctxt,node,0x6df,"The schematron document \'%s\' has no pattern",ctxt->URL,
                        in_R9);
    }
  }
  else {
    xmlSchematronPErr(ctxt,node,0x6df,"The XML document \'%s\' is not a XML schematron document",
                      ctxt->URL,in_R9);
    schema = (xmlSchematronPtr)0x0;
  }
  if (bVar5) {
    xmlFreeDoc(doc);
  }
  if (schema == (xmlSchematronPtr)0x0) {
    return (xmlSchematronPtr)0x0;
  }
LAB_001831cd:
  if (ctxt->nberrors != 0) {
    xmlSchematronFree(schema);
    return (xmlSchematronPtr)0x0;
  }
  schema->namespaces = ctxt->namespaces;
  schema->nbNamespaces = ctxt->nbNamespaces;
  ctxt->namespaces = (xmlChar **)0x0;
  return schema;
joined_r0x0018337f:
  if (cur == (_xmlNode *)0x0) goto LAB_0018317d;
  if (((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
     ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
      iVar7 != 0 ||
      (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
      iVar7 != 0)))) goto LAB_001833d2;
  cur = cur->next;
  goto joined_r0x0018337f;
LAB_001833d2:
  xVar2 = cur->type;
  while ((((xVar2 == XML_ELEMENT_NODE && (cur->ns != (xmlNs *)0x0)) &&
          (iVar7 = xmlStrEqual(cur->name,"ns"), iVar7 != 0)) &&
         ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
          iVar7 != 0 ||
          (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
          iVar7 != 0))))) {
    pxVar10 = xmlGetNoNsProp(cur,"prefix");
    pxVar11 = xmlGetNoNsProp(cur,"uri");
    if ((pxVar11 == (xmlChar *)0x0) || (*pxVar11 == '\0')) {
      xmlSchematronPErr(ctxt,cur,0x6df,"ns element has no uri",(xmlChar *)0x0,in_R9);
    }
    if ((pxVar10 == (xmlChar *)0x0) || (*pxVar10 == '\0')) {
      xmlSchematronPErr(ctxt,cur,0x6df,"ns element has no prefix",(xmlChar *)0x0,in_R9);
    }
    if (pxVar11 == (xmlChar *)0x0 || pxVar10 == (xmlChar *)0x0) {
      if (pxVar11 != (xmlChar *)0x0) goto LAB_001835c4;
    }
    else {
      xmlXPathRegisterNs(ctxt->xctxt,pxVar10,pxVar11);
      if (ctxt->namespaces == (xmlChar **)0x0) {
        ctxt->maxNamespaces = 10;
        ppxVar12 = (xmlChar **)(*xmlMalloc)(0xa0);
        ctxt->namespaces = ppxVar12;
        if (ppxVar12 != (xmlChar **)0x0) {
          ctxt->nbNamespaces = 0;
          goto LAB_00183535;
        }
LAB_001835a6:
        __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating parser namespaces");
      }
      else {
        if (ctxt->maxNamespaces <= ctxt->nbNamespaces + 2) {
          ppxVar12 = (xmlChar **)(*xmlRealloc)(ctxt->namespaces,(long)ctxt->maxNamespaces << 5);
          if (ppxVar12 == (xmlChar **)0x0) goto LAB_001835a6;
          ctxt->namespaces = ppxVar12;
          ctxt->maxNamespaces = ctxt->maxNamespaces << 1;
        }
LAB_00183535:
        pxVar13 = xmlDictLookup(ctxt->dict,pxVar11,-1);
        ctxt->namespaces[(long)ctxt->nbNamespaces * 2] = pxVar13;
        pxVar13 = xmlDictLookup(ctxt->dict,pxVar10,-1);
        iVar7 = ctxt->nbNamespaces;
        lVar1 = (long)iVar7 + 1;
        ctxt->namespaces[(long)iVar7 * 2 + 1] = pxVar13;
        ctxt->nbNamespaces = (int)lVar1;
        ctxt->namespaces[lVar1 * 2] = (xmlChar *)0x0;
        ctxt->namespaces[iVar7 * 2 + 3] = (xmlChar *)0x0;
      }
      schema->nbNs = schema->nbNs + 1;
LAB_001835c4:
      (*xmlFree)(pxVar11);
    }
    if (pxVar10 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar10);
    }
    cur = cur->next;
    while( true ) {
      if (cur == (_xmlNode *)0x0) goto LAB_0018317d;
      if (((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
         ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
          iVar7 != 0 ||
          (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
          iVar7 != 0)))) break;
      cur = cur->next;
    }
    xVar2 = cur->type;
  }
  do {
    if ((((cur->type == XML_ELEMENT_NODE) && (cur->ns != (xmlNs *)0x0)) &&
        (iVar7 = xmlStrEqual(cur->name,"pattern"), iVar7 != 0)) &&
       ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
        iVar7 != 0 ||
        (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
        iVar7 != 0)))) {
      pxVar10 = xmlGetNoNsProp(cur,"id");
      if (pxVar10 == (xmlChar *)0x0) {
        pxVar10 = xmlGetNoNsProp(cur,"name");
      }
      pxVar3 = ctxt->schema;
      if (pxVar10 == (xmlChar *)0x0 || pxVar3 == (xmlSchematronPtr)0x0) {
        if (pxVar10 != (xmlChar *)0x0) {
LAB_001837c9:
          (*xmlFree)(pxVar10);
        }
      }
      else {
        pxVar14 = (xmlSchematronPatternPtr)(*xmlMalloc)(0x18);
        if (pxVar14 == (xmlSchematronPatternPtr)0x0) {
          ctxt->nberrors = ctxt->nberrors + 1;
          __xmlSimpleError(0x10,2,cur,(char *)0x0,"allocating schema pattern");
          goto LAB_001837c9;
        }
        pxVar14->name = pxVar10;
        pxVar14->next = (xmlSchematronPatternPtr)0x0;
        pxVar14->rules = (xmlSchematronRulePtr_conflict)0x0;
        pxVar6 = pxVar3->patterns;
        if (pxVar3->patterns == (xmlSchematronPatternPtr_conflict)0x0) {
          pxVar20 = (xmlSchematronPatternPtr_conflict)&pxVar3->patterns;
        }
        else {
          do {
            pxVar20 = pxVar6;
            pxVar6 = pxVar20->next;
          } while (pxVar20->next != (xmlSchematronPatternPtr)0x0);
        }
        pxVar20->next = pxVar14;
        node_00 = cur->children;
        if (node_00 != (xmlNode *)0x0) {
          do {
            if (((node_00->type == XML_ELEMENT_NODE) && (node_00->ns != (xmlNs *)0x0)) &&
               ((iVar7 = xmlStrEqual(node_00->ns->href,
                                     (xmlChar *)"http://purl.oclc.org/dsdl/schematron"), iVar7 != 0
                || (iVar7 = xmlStrEqual(node_00->ns->href,
                                        (xmlChar *)"http://www.ascc.net/xml/schematron"), iVar7 != 0
                   )))) {
              local_38 = 0;
              goto LAB_00183866;
            }
            node_00 = node_00->next;
          } while (node_00 != (_xmlNode *)0x0);
        }
LAB_00183834:
        xmlSchematronPErr(ctxt,cur,0x6df,"Pattern has no rule element",(xmlChar *)0x0,in_R9);
      }
LAB_0018384e:
      schema->nbPattern = schema->nbPattern + 1;
    }
    else {
      xmlSchematronPErr(ctxt,cur,0x6df,"Expecting a pattern element instead of %s",cur->name,in_R9);
    }
    do {
      cur = cur->next;
      if (cur == (_xmlNode *)0x0) goto LAB_0018317d;
    } while (((cur->type != XML_ELEMENT_NODE) || (cur->ns == (xmlNs *)0x0)) ||
            ((iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
             iVar7 == 0 &&
             (iVar7 = xmlStrEqual(cur->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
             iVar7 == 0))));
  } while( true );
LAB_00183866:
  if ((((node_00->type == XML_ELEMENT_NODE) && (node_00->ns != (xmlNs *)0x0)) &&
      (iVar7 = xmlStrEqual(node_00->name,"rule"), iVar7 != 0)) &&
     ((iVar7 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
      iVar7 != 0 ||
      (iVar7 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
      iVar7 != 0)))) {
    pxVar10 = xmlGetNoNsProp(node_00,"context");
    if (pxVar10 == (xmlChar *)0x0) {
      pcVar19 = "rule has no context attribute";
LAB_00183db2:
      xmlSchematronPErr(ctxt,node_00,0x6df,pcVar19,(xmlChar *)0x0,in_R9);
    }
    else {
      if (*pxVar10 == '\0') {
        xmlSchematronPErr(ctxt,node_00,0x6df,"rule has an empty context attribute",(xmlChar *)0x0,
                          in_R9);
      }
      else {
        pxVar3 = ctxt->schema;
        if (pxVar3 != (xmlSchematronPtr)0x0) {
          pxVar15 = xmlPatterncompile(pxVar10,ctxt->dict,1,ctxt->namespaces);
          if (pxVar15 == (xmlPatternPtr)0x0) {
            xmlSchematronPErr(ctxt,node_00,0x6df,"Failed to compile context expression %s",pxVar10,
                              in_R9);
          }
          rule = (xmlSchematronRulePtr_conflict)(*xmlMalloc)(0x38);
          if (rule != (xmlSchematronRulePtr_conflict)0x0) {
            rule->patnext = (xmlSchematronRulePtr)0x0;
            rule->node = (xmlNodePtr)0x0;
            rule->context = (xmlChar *)0x0;
            rule->tests = (xmlSchematronTestPtr_conflict)0x0;
            rule->node = node_00;
            rule->context = pxVar10;
            rule->pattern = pxVar15;
            rule->report = (xmlChar *)0x0;
            rule->next = (xmlSchematronRulePtr)0x0;
            pxVar4 = pxVar3->rules;
            if (pxVar3->rules == (xmlSchematronRulePtr_conflict)0x0) {
              local_60 = (xmlNode *)&pxVar3->rules;
            }
            else {
              do {
                local_60 = (xmlNode *)pxVar4;
                pxVar4 = ((xmlSchematronRulePtr_conflict)local_60)->next;
              } while (((xmlSchematronRulePtr_conflict)local_60)->next != (xmlSchematronRulePtr)0x0)
              ;
            }
            local_60->_private = rule;
            rule->patnext = (xmlSchematronRulePtr)0x0;
            pxVar4 = pxVar14->rules;
            ppxVar16 = &pxVar14->rules;
            if (pxVar4 != (xmlSchematronRulePtr_conflict)0x0) {
              do {
                pxVar18 = pxVar4;
                pxVar4 = pxVar18->patnext;
              } while (pxVar4 != (xmlSchematronRulePtr)0x0);
              ppxVar16 = &pxVar18->patnext;
            }
            *ppxVar16 = rule;
            for (local_60 = node_00->children; local_60 != (_xmlNode *)0x0;
                local_60 = local_60->next) {
              if (((local_60->type == XML_ELEMENT_NODE) && (local_60->ns != (xmlNs *)0x0)) &&
                 ((iVar7 = xmlStrEqual(local_60->ns->href,
                                       (xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
                  iVar7 != 0 ||
                  (iVar7 = xmlStrEqual(local_60->ns->href,
                                       (xmlChar *)"http://www.ascc.net/xml/schematron"), iVar7 != 0)
                  ))) {
                iVar7 = 0;
                goto LAB_00183b2f;
              }
            }
LAB_00183da0:
            pcVar19 = "rule has no assert nor report element";
            goto LAB_00183db2;
          }
          ctxt->nberrors = ctxt->nberrors + 1;
          __xmlSimpleError(0x10,2,node_00,(char *)0x0,"allocating schema rule");
        }
      }
      (*xmlFree)(pxVar10);
    }
LAB_00183dba:
    local_38 = local_38 + 1;
  }
  else {
    xmlSchematronPErr(ctxt,node_00,0x6df,"Expecting a rule element instead of %s",node_00->name,
                      in_R9);
  }
  do {
    node_00 = node_00->next;
    if (node_00 == (_xmlNode *)0x0) {
      if (local_38 != 0) goto LAB_0018384e;
      goto LAB_00183834;
    }
  } while (((node_00->type != XML_ELEMENT_NODE) || (node_00->ns == (xmlNs *)0x0)) ||
          ((iVar7 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron")
           , iVar7 == 0 &&
           (iVar7 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
           iVar7 == 0))));
  goto LAB_00183866;
LAB_00183b2f:
  if (local_60->type == XML_ELEMENT_NODE) {
    if (((local_60->ns == (xmlNs *)0x0) ||
        (iVar8 = xmlStrEqual(local_60->name,"assert"), iVar8 == 0)) ||
       ((iVar8 = xmlStrEqual(local_60->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"),
        iVar8 == 0 &&
        (iVar8 = xmlStrEqual(local_60->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
        iVar8 == 0)))) {
      if ((((local_60->type != XML_ELEMENT_NODE) || (local_60->ns == (xmlNs *)0x0)) ||
          (iVar8 = xmlStrEqual(local_60->name,"report"), iVar8 == 0)) ||
         ((iVar8 = xmlStrEqual(local_60->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron")
          , iVar8 == 0 &&
          (iVar8 = xmlStrEqual(local_60->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
          iVar8 == 0)))) goto LAB_00183cc7;
      local_58 = xmlGetNoNsProp(local_60,"test");
      if (local_58 != (xmlChar *)0x0) {
        if (*local_58 == '\0') goto LAB_00183d6a;
        in_R9 = xmlNodeGetContent(local_60);
        type = XML_SCHEMATRON_REPORT;
        goto LAB_00183ca6;
      }
LAB_00183d4e:
      iVar7 = iVar7 + 1;
      pcVar19 = "assert has no test attribute";
      pxVar10 = (xmlChar *)0x0;
      goto LAB_00183cdf;
    }
    local_58 = xmlGetNoNsProp(local_60,"test");
    if (local_58 == (xmlChar *)0x0) goto LAB_00183d4e;
    if (*local_58 == '\0') {
LAB_00183d6a:
      xmlSchematronPErr(ctxt,local_60,0x6df,"assert has an empty test attribute",(xmlChar *)0x0,
                        in_R9);
LAB_00183d86:
      (*xmlFree)(local_58);
      iVar8 = iVar7 + 1;
    }
    else {
      in_R9 = xmlNodeGetContent(local_60);
      type = XML_SCHEMATRON_ASSERT;
LAB_00183ca6:
      pxVar17 = xmlSchematronAddTest(ctxt,type,rule,local_60,local_58,in_R9);
      iVar8 = iVar7 + 1;
      if (pxVar17 == (xmlSchematronTestPtr_conflict)0x0) goto LAB_00183d86;
    }
  }
  else {
LAB_00183cc7:
    pxVar10 = local_60->name;
    pcVar19 = "Expecting an assert or a report element instead of %s";
LAB_00183cdf:
    xmlSchematronPErr(ctxt,local_60,0x6df,pcVar19,pxVar10,in_R9);
    iVar8 = iVar7;
  }
  do {
    iVar7 = iVar8;
    local_60 = local_60->next;
    if (local_60 == (_xmlNode *)0x0) {
      if (iVar7 == 0) goto LAB_00183da0;
      goto LAB_00183dba;
    }
    iVar8 = iVar7;
  } while (((local_60->type != XML_ELEMENT_NODE) || (local_60->ns == (xmlNs *)0x0)) ||
          ((iVar9 = xmlStrEqual(local_60->ns->href,(xmlChar *)"http://purl.oclc.org/dsdl/schematron"
                               ), iVar9 == 0 &&
           (iVar9 = xmlStrEqual(local_60->ns->href,(xmlChar *)"http://www.ascc.net/xml/schematron"),
           iVar9 == 0))));
  goto LAB_00183b2f;
}

Assistant:

xmlSchematronPtr
xmlSchematronParse(xmlSchematronParserCtxtPtr ctxt)
{
    xmlSchematronPtr ret = NULL;
    xmlDocPtr doc;
    xmlNodePtr root, cur;
    int preserve = 0;

    if (ctxt == NULL)
        return (NULL);

    ctxt->nberrors = 0;

    /*
     * First step is to parse the input document into an DOM/Infoset
     */
    if (ctxt->URL != NULL) {
        doc = xmlReadFile((const char *) ctxt->URL, NULL,
	                  SCHEMATRON_PARSE_OPTIONS);
        if (doc == NULL) {
	    xmlSchematronPErr(ctxt, NULL,
			  XML_SCHEMAP_FAILED_LOAD,
                          "xmlSchematronParse: could not load '%s'.\n",
                          ctxt->URL, NULL);
            return (NULL);
        }
	ctxt->preserve = 0;
    } else if (ctxt->buffer != NULL) {
        doc = xmlReadMemory(ctxt->buffer, ctxt->size, NULL, NULL,
	                    SCHEMATRON_PARSE_OPTIONS);
        if (doc == NULL) {
	    xmlSchematronPErr(ctxt, NULL,
			  XML_SCHEMAP_FAILED_PARSE,
                          "xmlSchematronParse: could not parse.\n",
                          NULL, NULL);
            return (NULL);
        }
        doc->URL = xmlStrdup(BAD_CAST "in_memory_buffer");
        ctxt->URL = xmlDictLookup(ctxt->dict, BAD_CAST "in_memory_buffer", -1);
	ctxt->preserve = 0;
    } else if (ctxt->doc != NULL) {
        doc = ctxt->doc;
	preserve = 1;
	ctxt->preserve = 1;
    } else {
	xmlSchematronPErr(ctxt, NULL,
		      XML_SCHEMAP_NOTHING_TO_PARSE,
		      "xmlSchematronParse: could not parse.\n",
		      NULL, NULL);
        return (NULL);
    }

    /*
     * Then extract the root and Schematron parse it
     */
    root = xmlDocGetRootElement(doc);
    if (root == NULL) {
	xmlSchematronPErr(ctxt, (xmlNodePtr) doc,
		      XML_SCHEMAP_NOROOT,
		      "The schema has no document element.\n", NULL, NULL);
	if (!preserve) {
	    xmlFreeDoc(doc);
	}
        return (NULL);
    }

    if (!IS_SCHEMATRON(root, "schema")) {
	xmlSchematronPErr(ctxt, root,
	    XML_SCHEMAP_NOROOT,
	    "The XML document '%s' is not a XML schematron document",
	    ctxt->URL, NULL);
	goto exit;
    }
    ret = xmlSchematronNewSchematron(ctxt);
    if (ret == NULL)
        goto exit;
    ctxt->schema = ret;

    /*
     * scan the schema elements
     */
    cur = root->children;
    NEXT_SCHEMATRON(cur);
    if (IS_SCHEMATRON(cur, "title")) {
        xmlChar *title = xmlNodeGetContent(cur);
	if (title != NULL) {
	    ret->title = xmlDictLookup(ret->dict, title, -1);
	    xmlFree(title);
	}
	cur = cur->next;
	NEXT_SCHEMATRON(cur);
    }
    while (IS_SCHEMATRON(cur, "ns")) {
        xmlChar *prefix = xmlGetNoNsProp(cur, BAD_CAST "prefix");
        xmlChar *uri = xmlGetNoNsProp(cur, BAD_CAST "uri");
	if ((uri == NULL) || (uri[0] == 0)) {
	    xmlSchematronPErr(ctxt, cur,
		XML_SCHEMAP_NOROOT,
		"ns element has no uri", NULL, NULL);
	}
	if ((prefix == NULL) || (prefix[0] == 0)) {
	    xmlSchematronPErr(ctxt, cur,
		XML_SCHEMAP_NOROOT,
		"ns element has no prefix", NULL, NULL);
	}
	if ((prefix) && (uri)) {
	    xmlXPathRegisterNs(ctxt->xctxt, prefix, uri);
	    xmlSchematronAddNamespace(ctxt, prefix, uri);
	    ret->nbNs++;
	}
	if (uri)
	    xmlFree(uri);
	if (prefix)
	    xmlFree(prefix);
	cur = cur->next;
	NEXT_SCHEMATRON(cur);
    }
    while (cur != NULL) {
	if (IS_SCHEMATRON(cur, "pattern")) {
	    xmlSchematronParsePattern(ctxt, cur);
	    ret->nbPattern++;
	} else {
	    xmlSchematronPErr(ctxt, cur,
		XML_SCHEMAP_NOROOT,
		"Expecting a pattern element instead of %s", cur->name, NULL);
	}
	cur = cur->next;
	NEXT_SCHEMATRON(cur);
    }
    if (ret->nbPattern == 0) {
	xmlSchematronPErr(ctxt, root,
	    XML_SCHEMAP_NOROOT,
	    "The schematron document '%s' has no pattern",
	    ctxt->URL, NULL);
	goto exit;
    }
    /* the original document must be kept for reporting */
    ret->doc = doc;
    if (preserve) {
	    ret->preserve = 1;
    }
    preserve = 1;

exit:
    if (!preserve) {
	xmlFreeDoc(doc);
    }
    if (ret != NULL) {
	if (ctxt->nberrors != 0) {
	    xmlSchematronFree(ret);
	    ret = NULL;
	} else {
	    ret->namespaces = ctxt->namespaces;
	    ret->nbNamespaces = ctxt->nbNamespaces;
	    ctxt->namespaces = NULL;
	}
    }
    return (ret);
}